

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Bool DescendantOf(Node *element,TidyTagId tid)

{
  do {
    element = element->parent;
    if (element == (Node *)0x0) {
      return no;
    }
  } while ((element->tag == (Dict *)0x0) || (element->tag->id != tid));
  return yes;
}

Assistant:

static Bool DescendantOf( Node *element, TidyTagId tid )
{
    Node *parent;
    for ( parent = element->parent;
          parent != NULL;
          parent = parent->parent )
    {
        if ( TagIsId(parent, tid) )
            return yes;
    }
    return no;
}